

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteComment(ostream *os,string *comment)

{
  ulong uVar1;
  ostream *poVar2;
  string local_78 [48];
  string local_48 [32];
  long local_28;
  size_type rpos;
  size_type lpos;
  string *comment_local;
  ostream *os_local;
  
  lpos = (size_type)comment;
  comment_local = (string *)os;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    rpos = 0;
    std::operator<<((ostream *)comment_local,"\n#############################################\n");
    while (local_28 = std::__cxx11::string::find((char)lpos,10), local_28 != -1) {
      poVar2 = std::operator<<((ostream *)comment_local,"# ");
      std::__cxx11::string::substr((ulong)local_48,lpos);
      poVar2 = std::operator<<(poVar2,local_48);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_48);
      rpos = local_28 + 1;
    }
    poVar2 = std::operator<<((ostream *)comment_local,"# ");
    std::__cxx11::string::substr((ulong)local_78,lpos);
    poVar2 = std::operator<<(poVar2,local_78);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteComment(std::ostream& os,
                                          const std::string& comment)
{
  if (comment.empty()) {
    return;
  }

  std::string::size_type lpos = 0;
  std::string::size_type rpos;
  os << "\n#############################################\n";
  while ((rpos = comment.find('\n', lpos)) != std::string::npos) {
    os << "# " << comment.substr(lpos, rpos - lpos) << "\n";
    lpos = rpos + 1;
  }
  os << "# " << comment.substr(lpos) << "\n\n";
}